

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMPhysicalUsedByCurrentProcessPeak(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  char line [128];
  int local_a8;
  short local_a4;
  
  __stream = fopen("/proc/self/status","r");
  pcVar2 = fgets((char *)&local_a8,0x80,__stream);
  lVar3 = 0;
  while (pcVar2 != (char *)0x0) {
    if (local_a4 == 0x3a4d && local_a8 == 0x57486d56) {
      iVar1 = impl::ParseLine((char *)&local_a8);
      lVar3 = lVar3 + (long)iVar1 * 0x400;
    }
    pcVar2 = fgets((char *)&local_a8,0x80,__stream);
  }
  fclose(__stream);
  return lVar3;
}

Assistant:

int64_t npas4::GetRAMPhysicalUsedByCurrentProcessPeak()
{
#if defined(_WIN32)
	PROCESS_MEMORY_COUNTERS pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), &pmc, sizeof(pmc));
	return static_cast<int64_t>(pmc.PeakWorkingSetSize);
#elif defined(__APPLE__) && defined(__MACH__)
	struct rusage rusage;
	getrusage(RUSAGE_SELF, &rusage);
	return static_cast<int64_t>(rusage.ru_maxrss);
#else
	constexpr int BufferSize{128};
	int64_t result = 0;
	auto file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != nullptr)
	{
		if(strncmp(line, "VmHWM:", 6) == 0)
		{
			result += npas4::impl::ParseLine(line) * Kilobytes2Bytes;
		}
	}

	fclose(file);
	return static_cast<int64_t>(result);
#endif
}